

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_xta(DisasContext_conflict1 *s,arg_rrr_rot *a,VFPGen2OpSPFn_conflict *gen_extract,
            _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict1 *gen_add)

{
  ulong uVar1;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 ret;
  TCGv_i32 pTVar2;
  uintptr_t o;
  
  uVar1 = s->features;
  if ((uVar1 & 8) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    ret = load_reg(s,a->rm);
    tcg_gen_rotri_i32_aarch64(tcg_ctx,ret,ret,a->rot << 3);
    (*gen_extract)(tcg_ctx,ret,ret);
    if (a->rn != 0xf) {
      pTVar2 = load_reg(s,a->rn);
      (*gen_add)(tcg_ctx,ret,ret,pTVar2);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    }
    store_reg(s,a->rd,ret);
  }
  return SUB41(((uint)uVar1 & 8) >> 3,0);
}

Assistant:

static bool op_xta(DisasContext *s, arg_rrr_rot *a,
                   void (*gen_extract)(TCGContext *, TCGv_i32, TCGv_i32),
                   void (*gen_add)(TCGContext *, TCGv_i32, TCGv_i32, TCGv_i32))
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (!ENABLE_ARCH_6) {
        return false;
    }

    tmp = load_reg(s, a->rm);
    /*
     * TODO: In many cases we could do a shift instead of a rotate.
     * Combined with a simple extend, that becomes an extract.
     */
    tcg_gen_rotri_i32(tcg_ctx, tmp, tmp, a->rot * 8);
    gen_extract(tcg_ctx, tmp, tmp);

    if (a->rn != 15) {
        TCGv_i32 tmp2 = load_reg(s, a->rn);
        gen_add(tcg_ctx, tmp, tmp, tmp2);
        tcg_temp_free_i32(tcg_ctx, tmp2);
    }
    store_reg(s, a->rd, tmp);
    return true;
}